

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

HeapType __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,HeapType type)

{
  Random *this_00;
  uint uVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  iterator iVar4;
  value_type *pvVar5;
  FeatureOptions<wasm::HeapType> *pFVar6;
  HeapType HVar7;
  uintptr_t uVar8;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_58;
  key_type local_28;
  HeapType type_local;
  
  this_00 = &this->random;
  local_28.id = type.id;
  uVar2 = Random::upTo(this_00,3);
  if (uVar2 == 0) {
    return (HeapType)local_28.id;
  }
  if ((0xd < local_28.id) || (uVar2 = Random::upTo(this_00,2), uVar2 != 0)) {
LAB_00143eb0:
    iVar4 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->interestingHeapSubTypes)._M_h,&local_28);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      return (HeapType)local_28.id;
    }
    if (*(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x10) ==
        *(long *)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                        ._M_cur + 0x18)) {
      return (HeapType)local_28.id;
    }
    pvVar5 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this_00,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                ((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                                       ._M_cur + 0x10));
    return (HeapType)pvVar5->id;
  }
  if (0xd < local_28.id) {
    __assert_fail("isBasic() && \"Basic heap type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0x189,"BasicHeapType wasm::HeapType::getBasic() const");
  }
  if (10 < (uint)local_28.id) goto LAB_00143eb0;
  uVar8 = local_28.id & 0xffffffff;
  switch(uVar8) {
  case 0:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add<>
                       ((FeatureOptions<wasm::HeapType> *)&local_58,(FeatureSet)0x100,(HeapType)0x0)
    ;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar6,(FeatureSet)0x400,(HeapType)0xc);
    HVar7 = Random::pick<wasm::HeapType>(this_00,pFVar6);
    goto LAB_0014400b;
  case 1:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add<>
                       ((FeatureOptions<wasm::HeapType> *)&local_58,(FeatureSet)0x100,(HeapType)0x1)
    ;
    pFVar6 = Random::FeatureOptions<wasm::HeapType>::add<>(pFVar6,(FeatureSet)0x400,(HeapType)0xd);
    HVar7 = Random::pick<wasm::HeapType>(this_00,pFVar6);
LAB_0014400b:
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree(&local_58);
    return (HeapType)HVar7.id;
  case 2:
    uVar1 = (this->wasm->features).features;
    if ((uVar1 >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd79,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((uVar1 >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd7a,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar3 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this_00,any,eq,i31,struct_,array,none);
    goto LAB_0014408b;
  case 3:
    uVar1 = (this->wasm->features).features;
    if ((uVar1 >> 8 & 1) == 0) {
      __assert_fail("wasm.features.hasReferenceTypes()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd82,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    if ((uVar1 >> 10 & 1) == 0) {
      __assert_fail("wasm.features.hasGC()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0xd83,"HeapType wasm::TranslateToFuzzReader::getSubType(HeapType)");
    }
    BVar3 = Random::
            pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                      (this_00,eq,i31,struct_,array,none);
    goto LAB_0014408b;
  case 4:
    BVar3 = i31;
    break;
  case 5:
    BVar3 = struct_;
    break;
  case 6:
    BVar3 = array;
    break;
  case 7:
    goto switchD_00143f1c_caseD_7;
  default:
    ::wasm::handle_unreachable
              ("TODO: fuzz strings",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0xd94);
  }
  BVar3 = Random::pick<wasm::HeapType::BasicHeapType,wasm::HeapType::BasicHeapType>
                    (this_00,BVar3,none);
LAB_0014408b:
  uVar8 = (uintptr_t)BVar3;
switchD_00143f1c_caseD_7:
  return (HeapType)uVar8;
}

Assistant:

HeapType TranslateToFuzzReader::getSubType(HeapType type) {
  if (oneIn(3)) {
    return type;
  }
  if (type.isBasic() && oneIn(2)) {
    switch (type.getBasic()) {
      case HeapType::func:
        // TODO: Typed function references.
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::func)
                      .add(FeatureSet::GC, HeapType::nofunc));
      case HeapType::ext:
        return pick(FeatureOptions<HeapType>()
                      .add(FeatureSet::ReferenceTypes, HeapType::ext)
                      .add(FeatureSet::GC, HeapType::noext));
      case HeapType::any:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::any,
                    HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::eq:
        assert(wasm.features.hasReferenceTypes());
        assert(wasm.features.hasGC());
        return pick(HeapType::eq,
                    HeapType::i31,
                    HeapType::struct_,
                    HeapType::array,
                    HeapType::none);
      case HeapType::i31:
        return pick(HeapType::i31, HeapType::none);
      case HeapType::struct_:
        return pick(HeapType::struct_, HeapType::none);
      case HeapType::array:
        return pick(HeapType::array, HeapType::none);
      case HeapType::string:
        return HeapType::string;
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: fuzz strings");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        break;
    }
  }
  // Look for an interesting subtype.
  auto iter = interestingHeapSubTypes.find(type);
  if (iter != interestingHeapSubTypes.end()) {
    auto& subTypes = iter->second;
    if (!subTypes.empty()) {
      return pick(subTypes);
    }
  }
  // Failure to do anything interesting, return the type.
  return type;
}